

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_compress.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  pointer pbVar2;
  int iVar3;
  int iVar4;
  undefined1 local_98 [8];
  Mzp mzp;
  undefined1 local_58 [8];
  string mzp_out;
  
  mzp_out.field_2._8_8_ = argv;
  if (argc < 3) {
    fprintf(_stderr,"%s output input [input..]\n",*argv);
    iVar3 = -1;
  }
  else {
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mzp.header.magic[0] = '\0';
    mzp.header.magic[1] = '\0';
    mzp.header.magic[2] = '\0';
    mzp.header.magic[3] = '\0';
    mzp.header.magic[4] = '\0';
    mzp.header.magic[5] = '\0';
    mzp.header.archive_entry_count = 0;
    mzp.entry_headers.
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    mzp.entry_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)(uint)argc;
    pbVar2 = (pointer)0x2;
    iVar4 = 0;
    do {
      if (mzp.entry_data.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == pbVar2) {
        local_58 = (undefined1  [8])&mzp_out._M_string_length;
        mzp_out._M_dataplus._M_p = (pointer)0x0;
        mzp_out._M_string_length._0_1_ = 0;
        mg::data::mzp_write((Mzp *)local_98,(string *)local_58);
        bVar1 = mg::fs::write_file(*(char **)(mzp_out.field_2._8_8_ + 8),(string *)local_58);
        if (bVar1) {
          iVar3 = 0;
          fprintf(_stderr,"Wrote %ld bytes to %s\n",mzp_out._M_dataplus._M_p,
                  *(undefined8 *)(mzp_out.field_2._8_8_ + 8));
        }
        else {
          iVar3 = -1;
        }
        std::__cxx11::string::~string((string *)local_58);
        break;
      }
      local_58 = (undefined1  [8])&mzp_out._M_string_length;
      mzp_out._M_dataplus._M_p = (pointer)0x0;
      mzp_out._M_string_length._0_1_ = 0;
      bVar1 = mg::fs::read_file(*(char **)(mzp_out.field_2._8_8_ + (long)pbVar2 * 8),
                                (string *)local_58);
      iVar3 = -1;
      if (bVar1) {
        fprintf(_stderr,"Adding file %s\n",*(undefined8 *)(mzp_out.field_2._8_8_ + (long)pbVar2 * 8)
               );
        std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
        ::emplace_back<>((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                          *)&mzp);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_58);
        iVar3 = iVar4;
      }
      std::__cxx11::string::~string((string *)local_58);
      pbVar2 = (pointer)((long)&(pbVar2->_M_dataplus)._M_p + 1);
      iVar4 = iVar3;
    } while (bVar1);
    mg::data::Mzp::~Mzp((Mzp *)local_98);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 3) {
    fprintf(stderr, "%s output input [input..]\n", argv[0]);
    return -1;
  }

  // Constrct new MZP
  mg::data::Mzp mzp;

  // Read each input file as a new MZP record
  for (int i = 2; i < argc; i++) {
    std::string entry_data;
    if (!mg::fs::read_file(argv[i], entry_data)) {
      return -1;
    }

    fprintf(stderr, "Adding file %s\n", argv[i]);
    mzp.entry_headers.emplace_back();
    mzp.entry_data.emplace_back(entry_data);
  }

  // Write out the archive
  std::string mzp_out;
  mg::data::mzp_write(mzp, mzp_out);
  if (!mg::fs::write_file(argv[1], mzp_out)) {
    return -1;
  }
  fprintf(stderr, "Wrote %ld bytes to %s\n", mzp_out.size(), argv[1]);

  return 0;
}